

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrappers.pb.cc
# Opt level: O2

void __thiscall google::protobuf::Int32Value::SharedDtor(Int32Value *this)

{
  void *pvVar1;
  LogMessage *other;
  LogMessage local_50;
  LogFinisher local_11;
  
  pvVar1 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    pvVar1 = *(void **)((ulong)pvVar1 & 0xfffffffffffffffe);
  }
  if (pvVar1 != (void *)0x0) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/wrappers.pb.cc"
               ,0x460);
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: GetArena() == nullptr: ");
    internal::LogFinisher::operator=(&local_11,other);
    internal::LogMessage::~LogMessage(&local_50);
  }
  return;
}

Assistant:

void Int32Value::SharedDtor() {
  GOOGLE_DCHECK(GetArena() == nullptr);
}